

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImStrchrRange(char *str,char *str_end,char c)

{
  char c_local;
  char *str_end_local;
  char *str_local;
  
  str_end_local = str;
  while( true ) {
    if (str_end <= str_end_local) {
      return (char *)0x0;
    }
    if (*str_end_local == c) break;
    str_end_local = str_end_local + 1;
  }
  return str_end_local;
}

Assistant:

const char* ImStrchrRange(const char* str, const char* str_end, char c)
{
    for ( ; str < str_end; str++)
        if (*str == c)
            return str;
    return NULL;
}